

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O3

void __thiscall
Reader::parseexpression
          (Reader *this,iterator *it,iterator end,shared_ptr<Expression> *expr,bool isobj)

{
  ProcessedTokenType PVar1;
  char *__s;
  element_type *peVar2;
  char *pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  undefined8 uVar7;
  ProcessedToken *pPVar8;
  invalid_argument *piVar9;
  ProcessedToken *pPVar10;
  ProcessedToken *pPVar11;
  ProcessedToken *pPVar12;
  undefined7 in_register_00000081;
  Builder *name_00;
  shared_ptr<QuadTerm> quadterm_2;
  string name;
  shared_ptr<LinTerm> linterm;
  value_type local_a8;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  element_type *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_58 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000081,isobj);
  pPVar10 = it->_M_current;
  local_70 = (element_type *)expr;
  if ((pPVar10 != end._M_current) && (pPVar10->type == CONID)) {
    __s = (pPVar10->field_1).name;
    peVar2 = (expr->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pcVar3 = (char *)(peVar2->name)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&peVar2->name,0,pcVar3,(ulong)__s);
    pPVar10 = it->_M_current + 1;
    it->_M_current = pPVar10;
  }
  if (pPVar10 != end._M_current) {
    name_00 = &this->builder;
    do {
      pPVar8 = pPVar10 + 1;
      PVar1 = pPVar10->type;
      if (PVar1 == CONST && pPVar8 != end._M_current) {
        if (pPVar8->type == VARID) {
          std::__cxx11::string::string
                    ((string *)local_90,pPVar10[1].field_1.name,(allocator *)&local_68);
          local_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
          (((QuadTerm *)local_68._M_pi)->var1).
          super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          (((QuadTerm *)local_68._M_pi)->var1).
          super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (((QuadTerm *)local_68._M_pi)->var2).
          super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x3ff0000000000000;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<LinTerm*>
                    (&local_60,(LinTerm *)local_68._M_pi);
          *(anon_union_8_5_ebd6940d_for_ProcessedToken_1 *)(local_68._M_pi + 1) =
               it->_M_current->field_1;
          Builder::getvarbyname((Builder *)&local_a8,(string *)name_00);
          _Var6._M_pi = local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          peVar5 = local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var4 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_68._M_pi)->_M_use_count)->
                   _M_pi;
          (((shared_ptr<Variable> *)&(local_68._M_pi)->_vptr__Sp_counted_base)->
          super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)peVar5;
          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_68._M_pi)->_M_use_count)->_M_pi =
               _Var6._M_pi;
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          }
          if (local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi);
          }
          std::vector<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>::
          push_back((vector<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_> *)
                    (local_70->linterms).
                    super__Vector_base<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,(value_type *)&local_68);
          it->_M_current = it->_M_current + 2;
LAB_001dd107:
          if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
          }
          if (local_90[0] != local_80) {
            operator_delete(local_90[0]);
          }
        }
        else {
LAB_001dd04a:
          peVar2 = (element_type *)
                   (local_70->linterms).
                   super__Vector_base<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          peVar2->offset = (pPVar10->field_1).value + peVar2->offset;
          it->_M_current = pPVar10 + 1;
        }
      }
      else {
        if (PVar1 == VARID) {
          std::__cxx11::string::string
                    ((string *)local_90,(pPVar10->field_1).name,(allocator *)&local_68);
          local_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
          (((QuadTerm *)local_68._M_pi)->var1).
          super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          (((QuadTerm *)local_68._M_pi)->var1).
          super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (((QuadTerm *)local_68._M_pi)->var2).
          super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x3ff0000000000000;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<LinTerm*>
                    (&local_60,(LinTerm *)local_68._M_pi);
          ((__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)
          &local_68._M_pi[1]._vptr__Sp_counted_base)->_M_ptr = (element_type *)0x3ff0000000000000;
          Builder::getvarbyname((Builder *)&local_a8,(string *)name_00);
          _Var6._M_pi = local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          peVar5 = local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var4 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_68._M_pi)->_M_use_count)->
                   _M_pi;
          (((shared_ptr<Variable> *)&(local_68._M_pi)->_vptr__Sp_counted_base)->
          super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)peVar5;
          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_68._M_pi)->_M_use_count)->_M_pi =
               _Var6._M_pi;
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          }
          if (local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi);
          }
          std::vector<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>::
          push_back((vector<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_> *)
                    (local_70->linterms).
                    super__Vector_base<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,(value_type *)&local_68);
          it->_M_current = it->_M_current + 1;
          goto LAB_001dd107;
        }
        if (PVar1 == CONST) goto LAB_001dd04a;
        if (pPVar8 == end._M_current) {
          return;
        }
        if (PVar1 != BRKOP) {
          return;
        }
        it->_M_current = pPVar8;
        while ((pPVar8 != end._M_current && (PVar1 = pPVar8->type, PVar1 != BRKCL))) {
          pPVar10 = pPVar8 + 1;
          pPVar12 = pPVar8 + 2;
          if (pPVar10 == end._M_current) {
            pPVar12 = pPVar10;
          }
          pPVar11 = pPVar12 + (pPVar12 != end._M_current);
          if ((((pPVar11 == end._M_current) || (PVar1 != CONST)) || (pPVar10->type != VARID)) ||
             ((pPVar12->type != HAT || (pPVar11->type != CONST)))) {
            if (((pPVar12 != end._M_current) && ((PVar1 == VARID && (pPVar10->type == HAT)))) &&
               (pPVar12->type == CONST)) {
              std::__cxx11::string::string
                        ((string *)local_90,(pPVar8->field_1).name,(allocator *)&local_68);
              if (((pPVar12->field_1).value != 2.0) || (NAN((pPVar12->field_1).value))) {
                piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::invalid_argument::invalid_argument
                          (piVar9,"File not existent or illegal file format.");
                __cxa_throw(piVar9,&std::invalid_argument::typeinfo,
                            std::invalid_argument::~invalid_argument);
              }
              local_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
              (((QuadTerm *)local_68._M_pi)->var2).
              super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
              (((QuadTerm *)local_68._M_pi)->var2).
              super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              (((QuadTerm *)local_68._M_pi)->var1).
              super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
              (((QuadTerm *)local_68._M_pi)->var1).
              super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              ((QuadTerm *)local_68._M_pi)->coef = 1.0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<QuadTerm*>
                        (&local_60,(QuadTerm *)local_68._M_pi);
              local_68._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x3ff0000000000000;
              Builder::getvarbyname((Builder *)&local_a8,(string *)name_00);
              _Var6._M_pi = local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
              peVar5 = local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var4 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &(local_68._M_pi)->_M_use_count)->_M_pi;
              (((shared_ptr<Variable> *)&(local_68._M_pi)->_vptr__Sp_counted_base)->
              super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                   (element_type *)peVar5;
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_68._M_pi)->_M_use_count)->_M_pi
                   = _Var6._M_pi;
              if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
              }
              if (local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              Builder::getvarbyname((Builder *)&local_a8,(string *)name_00);
              _Var6._M_pi = local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
              peVar5 = local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var4 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &local_68._M_pi[1]._M_use_count)->_M_pi;
              ((__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)
              &local_68._M_pi[1]._vptr__Sp_counted_base)->_M_ptr = (element_type *)peVar5;
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_pi[1]._M_use_count)->_M_pi
                   = _Var6._M_pi;
              if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                 local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              std::vector<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>::
              push_back(&((element_type *)
                         (local_70->linterms).
                         super__Vector_base<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->quadterms,
                        (value_type *)&local_68);
              goto LAB_001dd401;
            }
            if ((((pPVar11 == end._M_current) || (PVar1 != CONST)) || (pPVar10->type != VARID)) ||
               ((pPVar12->type != ASTERISK || (pPVar11->type != VARID)))) {
              if (((pPVar12 == end._M_current) || ((PVar1 != VARID || (pPVar10->type != ASTERISK))))
                 || (pPVar12->type != VARID)) break;
              std::__cxx11::string::string
                        ((string *)local_90,(pPVar8->field_1).name,(allocator *)&local_68);
              std::__cxx11::string::string
                        ((string *)&local_68,(pPVar12->field_1).name,(allocator *)&local_a8);
              local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)operator_new(0x28);
              ((element_type *)
              local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->upperbound
                   = 0.0;
              (((element_type *)
               local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name).
              _M_dataplus._M_p = (pointer)0x0;
              *(undefined8 *)
               &((element_type *)
                local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type = 0;
              ((element_type *)
              local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->lowerbound
                   = 0.0;
              (((element_type *)
               local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name).
              _M_string_length = 0x3ff0000000000000;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<QuadTerm*>
                        (&local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,
                         local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
              ((string *)
              ((long)local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x18
              ))->_M_string_length = 0x3ff0000000000000;
              Builder::getvarbyname((Builder *)(local_58 + 0x10),(string *)name_00);
              _Var6._M_pi = _Stack_40._M_pi;
              uVar7 = local_58._16_8_;
              local_58._16_8_ = (element_type *)0x0;
              _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                        ((long)local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + 8);
              *(undefined8 *)
               &(local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1 =
                   uVar7;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8)
                   = _Var6._M_pi;
              if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
              }
              if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
              }
              Builder::getvarbyname((Builder *)(local_58 + 0x10),(string *)name_00);
              _Var6._M_pi = _Stack_40._M_pi;
              uVar7 = local_58._16_8_;
              local_58._16_8_ = (element_type *)0x0;
              _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       (((string *)
                        ((long)local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + 0x18))->_M_dataplus)._M_p;
              *(undefined8 *)
               &(local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var2 =
                   uVar7;
              (((string *)
               ((long)local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
               0x18))->_M_dataplus)._M_p = (pointer)_Var6._M_pi;
              if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                 _Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
              }
              std::vector<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>::
              push_back(&((element_type *)
                         (local_70->linterms).
                         super__Vector_base<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->quadterms,&local_a8);
            }
            else {
              std::__cxx11::string::string
                        ((string *)local_90,pPVar8[1].field_1.name,(allocator *)&local_68);
              std::__cxx11::string::string
                        ((string *)&local_68,(pPVar11->field_1).name,(allocator *)&local_a8);
              local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)operator_new(0x28);
              ((element_type *)
              local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->upperbound
                   = 0.0;
              (((element_type *)
               local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name).
              _M_dataplus._M_p = (pointer)0x0;
              *(undefined8 *)
               &((element_type *)
                local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type = 0;
              ((element_type *)
              local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->lowerbound
                   = 0.0;
              (((element_type *)
               local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name).
              _M_string_length = 0x3ff0000000000000;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<QuadTerm*>
                        (&local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,
                         local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
              ((string *)
              ((long)local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x18
              ))->_M_string_length = (size_type)it->_M_current->field_1;
              Builder::getvarbyname((Builder *)(local_58 + 0x10),(string *)name_00);
              _Var6._M_pi = _Stack_40._M_pi;
              uVar7 = local_58._16_8_;
              local_58._16_8_ = (element_type *)0x0;
              _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                        ((long)local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + 8);
              *(undefined8 *)
               &(local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var1 =
                   uVar7;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8)
                   = _Var6._M_pi;
              if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
              }
              if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
              }
              Builder::getvarbyname((Builder *)(local_58 + 0x10),(string *)name_00);
              _Var6._M_pi = _Stack_40._M_pi;
              uVar7 = local_58._16_8_;
              local_58._16_8_ = (element_type *)0x0;
              _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       (((string *)
                        ((long)local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + 0x18))->_M_dataplus)._M_p;
              *(undefined8 *)
               &(local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->var2 =
                   uVar7;
              (((string *)
               ((long)local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
               0x18))->_M_dataplus)._M_p = (pointer)_Var6._M_pi;
              if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                 _Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
              }
              std::vector<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>::
              push_back(&((element_type *)
                         (local_70->linterms).
                         super__Vector_base<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->quadterms,&local_a8);
              pPVar11 = pPVar11 + 1;
            }
            it->_M_current = pPVar11;
            if (local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((QuadTerm *)local_68._M_pi != (QuadTerm *)local_58) {
              operator_delete(local_68._M_pi);
            }
            if (local_90[0] != local_80) goto LAB_001dd6e4;
          }
          else {
            std::__cxx11::string::string
                      ((string *)local_90,pPVar8[1].field_1.name,(allocator *)&local_68);
            if (((pPVar11->field_1).value != 2.0) || (NAN((pPVar11->field_1).value))) {
              piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument
                        (piVar9,"File not existent or illegal file format.");
              __cxa_throw(piVar9,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            local_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
            (((QuadTerm *)local_68._M_pi)->var2).
            super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
            (((QuadTerm *)local_68._M_pi)->var2).
            super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            (((QuadTerm *)local_68._M_pi)->var1).
            super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
            (((QuadTerm *)local_68._M_pi)->var1).
            super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            ((QuadTerm *)local_68._M_pi)->coef = 1.0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<QuadTerm*>
                      (&local_60,(QuadTerm *)local_68._M_pi);
            *(anon_union_8_5_ebd6940d_for_ProcessedToken_1 *)(local_68._M_pi + 2) =
                 it->_M_current->field_1;
            Builder::getvarbyname((Builder *)&local_a8,(string *)name_00);
            _Var6._M_pi = local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            peVar5 = local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var4 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_68._M_pi)->_M_use_count)
                     ->_M_pi;
            (((shared_ptr<Variable> *)&(local_68._M_pi)->_vptr__Sp_counted_base)->
            super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                 (element_type *)peVar5;
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_68._M_pi)->_M_use_count)->_M_pi =
                 _Var6._M_pi;
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
            }
            if (local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            Builder::getvarbyname((Builder *)&local_a8,(string *)name_00);
            _Var6._M_pi = local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            peVar5 = local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var4 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_pi[1]._M_use_count)
                     ->_M_pi;
            ((__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)
            &local_68._M_pi[1]._vptr__Sp_counted_base)->_M_ptr = (element_type *)peVar5;
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_pi[1]._M_use_count)->_M_pi =
                 _Var6._M_pi;
            if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
               local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_a8.super___shared_ptr<QuadTerm,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            std::vector<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>::
            push_back(&((element_type *)
                       (local_70->linterms).
                       super__Vector_base<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->quadterms,(value_type *)&local_68
                     );
            pPVar11 = pPVar11 + 1;
LAB_001dd401:
            it->_M_current = pPVar11;
            if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
            }
            if (local_90[0] != local_80) {
LAB_001dd6e4:
              operator_delete(local_90[0]);
            }
          }
          pPVar8 = it->_M_current;
        }
        if ((char)local_34 == '\0') {
          if (pPVar8 == end._M_current) {
            piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (piVar9,"File not existent or illegal file format.");
            goto LAB_001dd896;
          }
          if (pPVar8->type != BRKCL) {
            piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (piVar9,"File not existent or illegal file format.");
            goto LAB_001dd896;
          }
          pPVar8 = pPVar8 + 1;
        }
        else {
          if ((pPVar8 + 1 == end._M_current) || (pPVar8 + 2 == end._M_current)) {
            piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (piVar9,"File not existent or illegal file format.");
LAB_001dd896:
            __cxa_throw(piVar9,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          if (pPVar8->type != BRKCL) {
            piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (piVar9,"File not existent or illegal file format.");
            goto LAB_001dd896;
          }
          if (pPVar8[1].type != SLASH) {
            piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (piVar9,"File not existent or illegal file format.");
            goto LAB_001dd896;
          }
          if (pPVar8[2].type != CONST) {
            piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (piVar9,"File not existent or illegal file format.");
            goto LAB_001dd896;
          }
          if ((pPVar8[2].field_1.value != 2.0) || (NAN(pPVar8[2].field_1.value))) {
            piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (piVar9,"File not existent or illegal file format.");
            goto LAB_001dd896;
          }
          pPVar8 = pPVar8 + 3;
        }
        it->_M_current = pPVar8;
      }
      pPVar10 = it->_M_current;
    } while (pPVar10 != end._M_current);
  }
  return;
}

Assistant:

void Reader::parseexpression(std::vector<ProcessedToken>::iterator& it,
                             std::vector<ProcessedToken>::iterator end,
                             std::shared_ptr<Expression> expr, bool isobj) {
  if (it != end && it->type == ProcessedTokenType::CONID) {
    expr->name = it->name;
    ++it;
  }

  while (it != end) {
    std::vector<ProcessedToken>::iterator next = it;
    ++next;
    // const var
    if (next != end && it->type == ProcessedTokenType::CONST &&
        next->type == ProcessedTokenType::VARID) {
      std::string name = next->name;

      std::shared_ptr<LinTerm> linterm =
          std::shared_ptr<LinTerm>(new LinTerm());
      linterm->coef = it->value;
      linterm->var = builder.getvarbyname(name);
      //	 printf("LpReader: Term   %+g %s\n", linterm->coef,
      //name.c_str());
      expr->linterms.push_back(linterm);

      ++it;
      ++it;
      continue;
    }

    // const
    if (it->type == ProcessedTokenType::CONST) {
      //      printf("LpReader: Offset change from %+g by %+g\n", expr->offset, it->value);
      expr->offset += it->value;
      ++it;
      continue;
    }

    // var
    if (it->type == ProcessedTokenType::VARID) {
      std::string name = it->name;

      std::shared_ptr<LinTerm> linterm =
          std::shared_ptr<LinTerm>(new LinTerm());
      linterm->coef = 1.0;
      linterm->var = builder.getvarbyname(name);
      //	 printf("LpReader: Term   %+g %s\n", linterm->coef,
      //name.c_str());
      expr->linterms.push_back(linterm);

      ++it;
      continue;
    }

    // quadratic expression
    if (next != end && it->type == ProcessedTokenType::BRKOP) {
      ++it;
      while (it != end && it->type != ProcessedTokenType::BRKCL) {
        // const var hat const
        std::vector<ProcessedToken>::iterator next1 = it;  // token after it
        std::vector<ProcessedToken>::iterator next2 = it;  // token 2nd-after it
        std::vector<ProcessedToken>::iterator next3 = it;  // token 3rd-after it
        ++next1;
        ++next2;
        ++next3;
        if (next1 != end) {
          ++next2;
          ++next3;
        }
        if (next2 != end) ++next3;

        if (next3 != end && it->type == ProcessedTokenType::CONST &&
            next1->type == ProcessedTokenType::VARID &&
            next2->type == ProcessedTokenType::HAT &&
            next3->type == ProcessedTokenType::CONST) {
          std::string name = next1->name;

          lpassert(next3->value == 2.0);

          std::shared_ptr<QuadTerm> quadterm =
              std::shared_ptr<QuadTerm>(new QuadTerm());
          quadterm->coef = it->value;
          quadterm->var1 = builder.getvarbyname(name);
          quadterm->var2 = builder.getvarbyname(name);
          expr->quadterms.push_back(quadterm);

          it = ++next3;
          continue;
        }

        // var hat const
        if (next2 != end && it->type == ProcessedTokenType::VARID &&
            next1->type == ProcessedTokenType::HAT &&
            next2->type == ProcessedTokenType::CONST) {
          std::string name = it->name;

          lpassert(next2->value == 2.0);

          std::shared_ptr<QuadTerm> quadterm =
              std::shared_ptr<QuadTerm>(new QuadTerm());
          quadterm->coef = 1.0;
          quadterm->var1 = builder.getvarbyname(name);
          quadterm->var2 = builder.getvarbyname(name);
          expr->quadterms.push_back(quadterm);

          it = next3;
          continue;
        }

        // const var asterisk var
        if (next3 != end && it->type == ProcessedTokenType::CONST &&
            next1->type == ProcessedTokenType::VARID &&
            next2->type == ProcessedTokenType::ASTERISK &&
            next3->type == ProcessedTokenType::VARID) {
          std::string name1 = next1->name;
          std::string name2 = next3->name;

          std::shared_ptr<QuadTerm> quadterm =
              std::shared_ptr<QuadTerm>(new QuadTerm());
          quadterm->coef = it->value;
          quadterm->var1 = builder.getvarbyname(name1);
          quadterm->var2 = builder.getvarbyname(name2);
          expr->quadterms.push_back(quadterm);

          it = ++next3;
          continue;
        }

        // var asterisk var
        if (next2 != end && it->type == ProcessedTokenType::VARID &&
            next1->type == ProcessedTokenType::ASTERISK &&
            next2->type == ProcessedTokenType::VARID) {
          std::string name1 = it->name;
          std::string name2 = next2->name;

          std::shared_ptr<QuadTerm> quadterm =
              std::shared_ptr<QuadTerm>(new QuadTerm());
          quadterm->coef = 1.0;
          quadterm->var1 = builder.getvarbyname(name1);
          quadterm->var2 = builder.getvarbyname(name2);
          expr->quadterms.push_back(quadterm);

          it = next3;
          continue;
        }
        break;
      }
      if (isobj) {
        // only in the objective function, a quadratic term is followed by
        // "/2.0"
        std::vector<ProcessedToken>::iterator next1 = it;  // token after it
        std::vector<ProcessedToken>::iterator next2 = it;  // token 2nd-after it
        ++next1;
        ++next2;
        if (next1 != end) ++next2;

        lpassert(next2 != end);
        lpassert(it->type == ProcessedTokenType::BRKCL);
        lpassert(next1->type == ProcessedTokenType::SLASH);
        lpassert(next2->type == ProcessedTokenType::CONST);
        lpassert(next2->value == 2.0);
        it = ++next2;
      } else {
        lpassert(it != end);
        lpassert(it->type == ProcessedTokenType::BRKCL);
        ++it;
      }
      continue;
    }

    break;
  }
}